

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::AddPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  void *pvVar1;
  wally_tx_witness_stack *pwVar2;
  uchar *witness;
  pointer pCVar3;
  wally_tx_witness_stack *pwVar4;
  int iVar5;
  CfdException *this_01;
  uchar *witness_len;
  ulong uVar6;
  int ret;
  wally_tx_witness_stack *stack_pointer;
  string function_name;
  int local_8c;
  wally_tx_witness_stack *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  undefined1 local_78 [16];
  char local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  local_80 = data;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6a8,"AddPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar6 = (ulong)tx_in_index;
  if (uVar6 < *(ulong *)((long)pvVar1 + 0x10)) {
    local_8c = 0;
    local_88 = (wally_tx_witness_stack *)0x0;
    local_78._0_8_ = local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"wally_tx_witness_stack_init_alloc","");
    local_38 = uVar6 * 0xd0;
    pwVar2 = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + local_38);
    pwVar4 = pwVar2;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) &&
       (local_8c = wally_tx_witness_stack_init_alloc(1,&local_88), pwVar4 = local_88, local_8c != 0)
       ) {
LAB_00468aa9:
      local_58._0_8_ = "cfdcore_elements_transaction.cpp";
      local_58._8_4_ = 0x6d5;
      local_58._16_8_ = "AddPeginWitnessStack";
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_8c);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"witness stack error.","");
      CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_58);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_88 = pwVar4;
    ::std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)local_78._8_8_,0x584c0f);
    witness = (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    iVar5 = wally_tx_witness_stack_add(local_88,witness,(size_t)witness_len);
    local_8c = iVar5;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) && (iVar5 == 0)) {
      *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + local_38) = local_88;
      local_88 = (wally_tx_witness_stack *)0x0;
    }
    else {
      if (local_88 != (wally_tx_witness_stack *)0x0 && pwVar2 == (wally_tx_witness_stack *)0x0) {
        wally_tx_witness_stack_free(local_88);
      }
      if (iVar5 != 0) goto LAB_00468aa9;
    }
    if ((char *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  SetElementsTxState(this);
  pCVar3 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)local_58,local_80);
  ScriptWitness::AddWitnessStack(&pCVar3[uVar6].pegin_witness_,(ByteData *)local_58);
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_78 + 8);
  local_78._0_8_ = &PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (this_00,&pCVar3[uVar6].pegin_witness_.witness_stack_);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,this_00);
  local_78._0_8_ = &PTR__ScriptWitness_0067f138;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::AddPeginWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].pegin_witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          tx_pointer->inputs[tx_in_index].pegin_witness = stack_pointer;
          stack_pointer = nullptr;
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].AddPeginWitnessStack(ByteData(data));
  return witness;
}